

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_StatusCode
copyChildNodesToNode
          (UA_Server *server,UA_Session *session,UA_NodeId *sourceNodeId,
          UA_NodeId *destinationNodeId,UA_InstantiationCallback *instantiationCallback)

{
  undefined2 uVar1;
  undefined2 uVar2;
  undefined4 uVar3;
  size_t sVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  undefined4 uVar7;
  session_list_entry *psVar8;
  undefined2 uVar9;
  undefined2 uVar10;
  undefined4 uVar11;
  undefined2 uVar12;
  undefined2 uVar13;
  undefined4 uVar14;
  UA_NodeId UVar15;
  UA_NodeId UVar16;
  UA_InstantiationCallback *pUVar17;
  UA_Boolean UVar18;
  int iVar19;
  UA_StatusCode UVar20;
  UA_NodeStoreEntry **ppUVar21;
  UA_Node *pUVar22;
  undefined4 extraout_var;
  UA_Node *pUVar23;
  ulong uVar24;
  UA_Byte *pUVar25;
  undefined8 *puVar26;
  UA_DataValue *v;
  undefined8 *puVar27;
  UA_NodeId *pUVar28;
  ulong uVar29;
  UA_Byte *pUVar30;
  UA_Server *server_00;
  bool bVar31;
  bool bVar32;
  UA_BrowseDescription local_378;
  undefined1 auStack_328 [8];
  UA_BrowseResult br;
  undefined1 auStack_2f8 [8];
  UA_NodeId mandatoryId;
  UA_PublishResponseEntry *local_1f8;
  UA_PublishResponseEntry **ppUStack_1f0;
  anon_union_16_4_621dfe33_for_identifier local_1e8;
  undefined1 auStack_1d8 [8];
  UA_NodeId id_1;
  undefined1 auStack_108 [8];
  UA_DataValue value;
  UA_NodeId local_78;
  ulong local_58;
  UA_Byte *local_50;
  UA_NodeId *local_48;
  UA_InstantiationCallback *local_40;
  undefined8 *local_38;
  
  local_378._68_4_ = 0;
  local_378.referenceTypeId.identifier.string.length._4_4_ = 0;
  local_378.referenceTypeId.identifier.string.data = (UA_Byte *)0x0;
  local_378.referenceTypeId._2_2_ = 0;
  local_378.nodeId.namespaceIndex = sourceNodeId->namespaceIndex;
  local_378.nodeId._2_2_ = *(undefined2 *)&sourceNodeId->field_0x2;
  local_378.nodeId.identifierType = sourceNodeId->identifierType;
  local_378.nodeId.identifier.string.length = (sourceNodeId->identifier).string.length;
  local_378.nodeId.identifier.string.data = (sourceNodeId->identifier).string.data;
  local_378.referenceTypeId.namespaceIndex = 0;
  local_378.referenceTypeId.identifierType = UA_NODEIDTYPE_NUMERIC;
  local_378.referenceTypeId.identifier.numeric = 0x2c;
  local_378.includeSubtypes = true;
  local_378._57_3_ = 0;
  local_378.browseDirection = UA_BROWSEDIRECTION_FORWARD;
  local_378._28_4_ = 0;
  local_378.nodeClassMask = 7;
  local_378.resultMask = 0xd;
  br.continuationPoint.length = 0;
  br.continuationPoint.data = (UA_Byte *)0x0;
  auStack_328 = (undefined1  [8])0x0;
  br.statusCode = 0;
  br._4_4_ = 0;
  br.referencesSize = 0;
  Service_Browse_single
            (server,session,(ContinuationPointEntry *)0x0,&local_378,0,
             (UA_BrowseResult *)auStack_328);
  if (auStack_328._0_4_ == 0) {
    local_58 = 0;
    local_78.namespaceIndex = 0;
    local_78._2_2_ = 0;
    local_78.identifierType = UA_NODEIDTYPE_NUMERIC;
    local_78.identifier.string.length = 0;
    local_78.identifier.string.data = (UA_Byte *)0x0;
    local_40 = instantiationCallback;
    if (br.continuationPoint.data != (UA_Byte *)0x0) {
      pUVar30 = (UA_Byte *)0x0;
      local_58 = 0;
      do {
        local_38 = (undefined8 *)br.referencesSize;
        pUVar28 = (UA_NodeId *)(br.referencesSize + (long)pUVar30 * 0xc0 + 0x20);
        auStack_2f8._0_2_ = 0;
        auStack_2f8._4_4_ = UA_NODEIDTYPE_NUMERIC;
        mandatoryId.namespaceIndex = 0x4e;
        mandatoryId._2_2_ = 0;
        auStack_1d8._0_2_ = 0;
        auStack_1d8._4_4_ = UA_NODEIDTYPE_NUMERIC;
        id_1.namespaceIndex = 0x25;
        id_1._2_2_ = 0;
        ppUVar21 = findNode(server->nodestore,pUVar28);
        if (ppUVar21 == (UA_NodeStoreEntry **)0x0) {
          pUVar22 = (UA_Node *)0x0;
        }
        else {
          pUVar22 = &(*ppUVar21)->node;
        }
        if (pUVar22 == (UA_Node *)0x0) {
          bVar32 = false;
          pUVar25 = pUVar30;
        }
        else {
          uVar24 = pUVar22->referencesSize;
          bVar31 = uVar24 != 0;
          local_50 = pUVar30;
          local_48 = pUVar28;
          if (bVar31) {
            pUVar28 = &(pUVar22->references->targetId).nodeId;
            bVar31 = true;
            uVar29 = 1;
            do {
              UVar18 = UA_NodeId_equal((UA_NodeId *)auStack_1d8,
                                       (UA_NodeId *)((long)&pUVar28[-2].identifier + 8));
              if (((UVar18) && (UVar18 = UA_NodeId_equal((UA_NodeId *)auStack_2f8,pUVar28), UVar18))
                 && (pUVar28[-1].identifier.guid.data4[0] != '\x01')) break;
              bVar31 = uVar29 < uVar24;
              pUVar28 = (UA_NodeId *)&pUVar28[3].identifier;
              bVar32 = uVar29 != uVar24;
              uVar29 = uVar29 + 1;
            } while (bVar32);
          }
          pUVar25 = local_50;
          bVar32 = false;
          if (bVar31) {
            local_38 = local_38 + (long)pUVar30 * 0x18;
            mandatoryId.identifier.string.length =
                 (size_t)(destinationNodeId->identifier).string.data;
            uVar1 = destinationNodeId->namespaceIndex;
            uVar2 = *(undefined2 *)&destinationNodeId->field_0x2;
            uVar3 = destinationNodeId->identifierType;
            sVar4 = (destinationNodeId->identifier).string.length;
            mandatoryId._0_4_ = SUB84(sVar4,0);
            mandatoryId.identifierType = (UA_NodeIdType)(sVar4 >> 0x20);
            mandatoryId.identifier.string.data = (UA_Byte *)0x0;
            id_1.identifier.string.length = 0;
            id_1.identifier.string.data = (UA_Byte *)0x0;
            auStack_1d8._0_2_ = 0;
            auStack_1d8._2_2_ = 0;
            auStack_1d8._4_4_ = UA_NODEIDTYPE_NUMERIC;
            id_1.namespaceIndex = 0;
            id_1._2_2_ = 0;
            id_1.identifierType = UA_NODEIDTYPE_NUMERIC;
            v = (UA_DataValue *)0x0;
            auStack_2f8._0_2_ = uVar1;
            auStack_2f8._2_2_ = uVar2;
            auStack_2f8._4_4_ = uVar3;
            Service_Browse_single
                      (server,session,(ContinuationPointEntry *)0x0,
                       (UA_BrowseDescription *)auStack_2f8,0,(UA_BrowseResult *)auStack_1d8);
            uVar24 = (ulong)CONCAT22(auStack_1d8._2_2_,auStack_1d8._0_2_);
            if (CONCAT22(auStack_1d8._2_2_,auStack_1d8._0_2_) == 0) {
              if (id_1.identifier.string.data == (UA_Byte *)0x0) {
                uVar24 = 0;
              }
              else {
                pUVar30 = (UA_Byte *)0x0;
                puVar27 = (undefined8 *)0x60;
                uVar24 = 0;
                puVar26 = local_38;
                do {
                  bVar32 = true;
                  if (((*(short *)(puVar27 + -2) == *(short *)(puVar26 + 10)) &&
                      (puVar27[-1] == puVar26[0xb])) &&
                     (iVar19 = bcmp((void *)*puVar27,(void *)local_38[0xc],puVar27[-1]),
                     puVar26 = local_38, iVar19 == 0)) {
                    UVar20 = UA_copy(puVar27 + -8,&local_78,UA_TYPES + 0x10);
                    uVar24 = (ulong)UVar20;
                    bVar32 = false;
                    puVar26 = local_38;
                  }
                  if (!bVar32) break;
                  pUVar30 = pUVar30 + 1;
                  puVar27 = puVar27 + 0x18;
                } while (pUVar30 < id_1.identifier.string.data);
              }
              deleteMembers_noInit(auStack_1d8,UA_TYPES + 0x98);
              id_1.identifier.string.length = 0;
              id_1.identifier.string.data = (UA_Byte *)0x0;
              auStack_1d8._0_2_ = 0;
              auStack_1d8._2_2_ = 0;
              auStack_1d8._4_4_ = UA_NODEIDTYPE_NUMERIC;
              id_1.namespaceIndex = 0;
              id_1._2_2_ = 0;
              id_1.identifierType = UA_NODEIDTYPE_NUMERIC;
              pUVar25 = local_50;
            }
            bVar32 = true;
            local_58 = uVar24;
            if ((int)uVar24 == 0) {
              UVar18 = UA_NodeId_equal(&UA_NODEID_NULL,&local_78);
              iVar19 = *(int *)(local_38 + 0x11);
              if (UVar18) {
                if (iVar19 == 1) {
                  ppUVar21 = findNode(server->nodestore,local_48);
                  if (ppUVar21 == (UA_NodeStoreEntry **)0x0) {
                    pUVar22 = (UA_Node *)0x0;
                  }
                  else {
                    pUVar22 = &(*ppUVar21)->node;
                  }
                  if (pUVar22 == (UA_Node *)0x0) {
LAB_0012cda1:
                    uVar24 = 0x80330000;
                  }
                  else {
                    uVar24 = 0x805f0000;
                    if (pUVar22->nodeClass == UA_NODECLASS_OBJECT) {
                      auStack_1d8._0_2_ = 0;
                      auStack_1d8._2_2_ = 0;
                      auStack_1d8._4_4_ = UA_NODEIDTYPE_NUMERIC;
                      sVar4 = (pUVar22->displayName).locale.length;
                      id_1.identifier.string.length = (size_t)(pUVar22->displayName).locale.data;
                      id_1.identifier.string.data = (UA_Byte *)(pUVar22->displayName).text.length;
                      id_1._0_4_ = SUB84(sVar4,0);
                      id_1.identifierType = (UA_NodeIdType)(sVar4 >> 0x20);
                      memset(auStack_2f8,0,0xf8);
                      mandatoryId.identifier.string.length =
                           (size_t)(destinationNodeId->identifier).string.data;
                      uVar12 = destinationNodeId->namespaceIndex;
                      uVar13 = *(undefined2 *)&destinationNodeId->field_0x2;
                      uVar14 = destinationNodeId->identifierType;
                      sVar4 = (destinationNodeId->identifier).string.length;
                      mandatoryId._0_4_ = SUB84(sVar4,0);
                      mandatoryId.identifierType = (UA_NodeIdType)(sVar4 >> 0x20);
                      auStack_2f8._0_2_ = uVar12;
                      auStack_2f8._2_2_ = uVar13;
                      auStack_2f8._4_4_ = uVar14;
                      pUVar23 = getNodeType(server,pUVar22);
                      uVar24 = 0x80630000;
                      if (((pUVar23 != (UA_Node *)0x0) &&
                          (pUVar23->nodeClass == UA_NODECLASS_OBJECTTYPE)) &&
                         ((char)pUVar23[1].nodeId.namespaceIndex == '\0')) {
                        value.value.type = (UA_DataType *)0x0;
                        value.value.storageType = UA_VARIANT_DATA;
                        value.value._12_4_ = 0;
                        auStack_108 = (undefined1  [8])0x0;
                        value._0_8_ = 0;
                        Service_AddNodes_single
                                  (server,session,(UA_AddNodesItem *)auStack_2f8,
                                   (UA_AddNodesResult *)auStack_108,local_40);
                        pUVar17 = local_40;
                        uVar24 = (ulong)auStack_108 & 0xffffffff;
                        if (auStack_108._0_4_ == 0) {
                          UVar20 = copyChildNodesToNode
                                             (server,session,&pUVar22->nodeId,(UA_NodeId *)&value,
                                              local_40);
                          uVar24 = (ulong)UVar20;
                          if ((pUVar17 != (UA_InstantiationCallback *)0x0) && (UVar20 == 0)) {
                            UVar16.identifier.string.length = (size_t)value.value.type;
                            UVar16.namespaceIndex = value._0_2_;
                            UVar16._2_2_ = value._2_2_;
                            UVar16.identifierType = value._4_4_;
                            UVar16.identifier.string.data = (UA_Byte *)value.value._8_8_;
                            (*local_40->method)(UVar16,pUVar22->nodeId,local_40->handle);
                          }
                          deleteMembers_noInit(&value,UA_TYPES + 0x10);
                          value._0_8_ = 0;
                          value.value.type = (UA_DataType *)0x0;
                          value.value.storageType = UA_VARIANT_DATA;
                          value.value._12_4_ = 0;
                          pUVar25 = local_50;
                        }
                      }
                    }
                  }
                }
                else if (iVar19 == 2) {
                  ppUVar21 = findNode(server->nodestore,local_48);
                  if (ppUVar21 == (UA_NodeStoreEntry **)0x0) {
                    server_00 = (UA_Server *)0x0;
                  }
                  else {
                    server_00 = (UA_Server *)&(*ppUVar21)->node;
                  }
                  if (server_00 == (UA_Server *)0x0) goto LAB_0012cda1;
                  uVar24 = 0x805f0000;
                  if (*(int *)&(server_00->secureChannelManager).channels.lh_first == 2) {
                    value.sourcePicoseconds = 0;
                    value._74_6_ = 0;
                    value.serverTimestamp = 0;
                    value.status = 0;
                    value._60_4_ = 0;
                    value.sourceTimestamp = 0;
                    value.value.arrayDimensionsSize = 0;
                    value.value.arrayDimensions = (UA_UInt32 *)0x0;
                    value.value.arrayLength = 0;
                    value.value.data = (void *)0x0;
                    value.value.type = (UA_DataType *)0x0;
                    value.value.storageType = UA_VARIANT_DATA;
                    value.value._12_4_ = 0;
                    auStack_108 = (undefined1  [8])0x0;
                    value._0_8_ = 0;
                    UVar20 = readValueAttributeComplete
                                       (server_00,(UA_VariableNode *)0x3,
                                        UA_TIMESTAMPSTORETURN_SOURCE,(UA_String *)auStack_108,v);
                    uVar24 = (ulong)UVar20;
                    if (UVar20 == 0) {
                      memset(auStack_1d8,0,200);
                      psVar8 = (server_00->sessionManager).sessions.lh_first;
                      id_1.identifier.string.length =
                           *(undefined8 *)&(server_00->sessionManager).currentSessionCount;
                      id_1.identifier.string.data = (UA_Byte *)(server_00->sessionManager).server;
                      id_1._0_4_ = SUB84(psVar8,0);
                      id_1.identifierType = (UA_NodeIdType)((ulong)psVar8 >> 0x20);
                      memset(auStack_2f8,0,0xf8);
                      mandatoryId.identifier.string.length =
                           (size_t)(destinationNodeId->identifier).string.data;
                      uVar9 = destinationNodeId->namespaceIndex;
                      uVar10 = *(undefined2 *)&destinationNodeId->field_0x2;
                      uVar11 = destinationNodeId->identifierType;
                      sVar4 = (destinationNodeId->identifier).string.length;
                      mandatoryId._0_4_ = SUB84(sVar4,0);
                      mandatoryId.identifierType = (UA_NodeIdType)(sVar4 >> 0x20);
                      auStack_2f8._0_2_ = uVar9;
                      auStack_2f8._2_2_ = uVar10;
                      auStack_2f8._4_4_ = uVar11;
                      pUVar22 = getNodeType(server,(UA_Node *)server_00);
                      uVar24 = 0x80630000;
                      if (((pUVar22 != (UA_Node *)0x0) &&
                          (pUVar22->nodeClass == UA_NODECLASS_VARIABLETYPE)) &&
                         ((char)pUVar22[2].browseName.namespaceIndex == '\0')) {
                        local_1e8.string.length = 0;
                        local_1e8.string.data = (UA_Byte *)0x0;
                        local_1f8 = (UA_PublishResponseEntry *)0x0;
                        ppUStack_1f0 = (UA_PublishResponseEntry **)0x0;
                        Service_AddNodes_single
                                  (server,session,(UA_AddNodesItem *)auStack_2f8,
                                   (UA_AddNodesResult *)&local_1f8,local_40);
                        pUVar17 = local_40;
                        uVar24 = (ulong)local_1f8 & 0xffffffff;
                        if ((UA_StatusCode)local_1f8 == 0) {
                          UVar20 = copyChildNodesToNode
                                             (server,session,(UA_NodeId *)server_00,
                                              (UA_NodeId *)&ppUStack_1f0,local_40);
                          uVar24 = CONCAT44(extraout_var,UVar20);
                          if ((pUVar17 != (UA_InstantiationCallback *)0x0) && (UVar20 == 0)) {
                            UVar15.identifier.string.length = local_1e8.string.length;
                            UVar15._0_8_ = ppUStack_1f0;
                            UVar15.identifier.string.data = local_1e8.string.data;
                            (*local_40->method)(UVar15,*(UA_NodeId *)server_00,local_40->handle);
                          }
                          deleteMembers_noInit((UA_NodeId *)&ppUStack_1f0,UA_TYPES + 0x10);
                          ppUStack_1f0 = (UA_PublishResponseEntry **)0x0;
                          local_1e8.string.length = 0;
                          local_1e8.string.data = (UA_Byte *)0x0;
                        }
                      }
                      pUVar25 = local_50;
                      if ((((ulong)auStack_108 & 1) != 0) && ((int)value.value.type == 0)) {
                        deleteMembers_noInit(&value,UA_TYPES + 0x17);
                        value.value.data = (void *)0x0;
                        value.value.arrayDimensionsSize = 0;
                        value.value.storageType = UA_VARIANT_DATA;
                        value.value._12_4_ = 0;
                        value.value.arrayLength = 0;
                        value._0_8_ = 0;
                        value.value.type = (UA_DataType *)0x0;
                        pUVar25 = local_50;
                      }
                    }
                  }
                }
                else {
                  uVar24 = 0;
                  if (iVar19 == 4) {
                    mandatoryId.identifier.string.length =
                         (size_t)(destinationNodeId->identifier).string.data;
                    uVar5 = destinationNodeId->namespaceIndex;
                    uVar6 = *(undefined2 *)&destinationNodeId->field_0x2;
                    uVar7 = destinationNodeId->identifierType;
                    sVar4 = (destinationNodeId->identifier).string.length;
                    mandatoryId._0_4_ = SUB84(sVar4,0);
                    mandatoryId.identifierType = (UA_NodeIdType)(sVar4 >> 0x20);
                    mandatoryId.identifier.string.data = (UA_Byte *)*local_38;
                    auStack_2f8._0_2_ = uVar5;
                    auStack_2f8._2_2_ = uVar6;
                    auStack_2f8._4_4_ = uVar7;
                    UVar20 = addReference(server,(UA_Session *)auStack_2f8,
                                          (UA_AddReferencesItem *)0x0);
                    uVar24 = (ulong)UVar20;
                  }
                }
              }
              else {
                uVar24 = 0;
                if ((iVar19 - 1U < 2) &&
                   (UVar18 = UA_NodeId_equal(local_48,&local_78), pUVar25 = local_50, !UVar18)) {
                  UVar20 = copyChildNodesToNode(server,session,local_48,&local_78,local_40);
                  uVar24 = (ulong)UVar20;
                }
                deleteMembers_noInit(&local_78,UA_TYPES + 0x10);
                local_78.namespaceIndex = 0;
                local_78._2_2_ = 0;
                local_78.identifierType = UA_NODEIDTYPE_NUMERIC;
                local_78.identifier.string.length = 0;
                local_78.identifier.string.data = (UA_Byte *)0x0;
              }
              bVar32 = (int)uVar24 != 0;
              local_58 = uVar24;
            }
          }
        }
      } while ((!bVar32) && (pUVar30 = pUVar25 + 1, pUVar30 < br.continuationPoint.data));
    }
    deleteMembers_noInit(auStack_328,UA_TYPES + 0x98);
    auStack_328._0_4_ = (undefined4)local_58;
  }
  return auStack_328._0_4_;
}

Assistant:

static UA_StatusCode
copyChildNodesToNode(UA_Server* server, UA_Session* session,
                     const UA_NodeId* sourceNodeId, const UA_NodeId* destinationNodeId,
                     UA_InstantiationCallback* instantiationCallback) {
    /* Browse to get all children */
    UA_BrowseDescription bd;
    UA_BrowseDescription_init(&bd);
    bd.nodeId = *sourceNodeId;
    bd.referenceTypeId = UA_NODEID_NUMERIC(0, UA_NS0ID_AGGREGATES);
    bd.includeSubtypes = true;
    bd.browseDirection = UA_BROWSEDIRECTION_FORWARD;
    bd.nodeClassMask = UA_NODECLASS_OBJECT | UA_NODECLASS_VARIABLE | UA_NODECLASS_METHOD;
    bd.resultMask = UA_BROWSERESULTMASK_REFERENCETYPEID | UA_BROWSERESULTMASK_NODECLASS |
        UA_BROWSERESULTMASK_BROWSENAME;

    UA_BrowseResult br;
    UA_BrowseResult_init(&br);
    Service_Browse_single(server, session, NULL, &bd, 0, &br);
    if(br.statusCode != UA_STATUSCODE_GOOD)
        return br.statusCode;

    /* Copy all children */
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    UA_NodeId existingChild = UA_NODEID_NULL;
    for(size_t i = 0; i < br.referencesSize; ++i) {
        UA_ReferenceDescription *rd = &br.references[i];

        /* Is the child mandatory? If not, skip */
        if(!mandatoryChild(server, session, &rd->nodeId.nodeId))
            continue;

        /* TODO: If a child is optional, check whether optional children that
         * were manually added fit the constraints. */

        /* Check for deduplication */
        retval = instanceFindAggregateByBrowsename(server, session, destinationNodeId,
                                                   &rd->browseName, &existingChild);
        if(retval != UA_STATUSCODE_GOOD)
            break;

        if(UA_NodeId_equal(&UA_NODEID_NULL, &existingChild)) {
            /* New node in child */
            if(rd->nodeClass == UA_NODECLASS_METHOD) {
                /* add a reference to the method in the objecttype */
                UA_AddReferencesItem newItem;
                UA_AddReferencesItem_init(&newItem);
                newItem.sourceNodeId = *destinationNodeId;
                newItem.referenceTypeId = rd->referenceTypeId;
                newItem.isForward = true;
                newItem.targetNodeId = rd->nodeId;
                newItem.targetNodeClass = UA_NODECLASS_METHOD;
                retval = addReference(server, session, &newItem);
            } else if(rd->nodeClass == UA_NODECLASS_VARIABLE)
                retval = copyExistingVariable(server, session, &rd->nodeId.nodeId,
                                              &rd->referenceTypeId, destinationNodeId,
                                              instantiationCallback);
            else if(rd->nodeClass == UA_NODECLASS_OBJECT)
                retval = copyExistingObject(server, session, &rd->nodeId.nodeId,
                                            &rd->referenceTypeId, destinationNodeId,
                                            instantiationCallback);
        } else {
            /* Preexistent node in child
             * General strategy if we meet an already existing node:
             * - Preexistent variable contents always 'win' overwriting anything
             *   supertypes would instantiate
             * - Always copy contents of template *into* existant node (merge
             *   contents of e.g. Folders like ParameterSet) */
            if(rd->nodeClass == UA_NODECLASS_METHOD) {
                /* Do nothing, existent method wins */
            } else if(rd->nodeClass == UA_NODECLASS_VARIABLE ||
                      rd->nodeClass == UA_NODECLASS_OBJECT) {
                if(!UA_NodeId_equal(&rd->nodeId.nodeId, &existingChild))
                    retval = copyChildNodesToNode(server, session, &rd->nodeId.nodeId,
                                                  &existingChild, instantiationCallback);
            }
            UA_NodeId_deleteMembers(&existingChild);
        }
        if(retval != UA_STATUSCODE_GOOD)
            break;
    }
    UA_BrowseResult_deleteMembers(&br);
    return retval;
}